

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckEndOfFileNewLine.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckEndOfFileNewLine(Parser *this)

{
  string *this_00;
  char cVar1;
  char cVar2;
  char *pcVar3;
  pointer pcVar4;
  long lVar5;
  size_type sVar6;
  size_t pos;
  ulong uVar7;
  Error error;
  
  this->m_TestsDone[9] = true;
  pcVar3 = (char *)operator_new__(0xff);
  builtin_strncpy(pcVar3,"The file should have only one new line",0x27);
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 9));
  operator_delete__(pcVar3);
  pcVar4 = (this->m_Buffer)._M_dataplus._M_p;
  sVar6 = (this->m_Buffer)._M_string_length;
  pos = sVar6 - 1;
  cVar1 = pcVar4[sVar6 - 1];
  if (cVar1 != '\n') {
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    error.line = GetLineNumber(this,pos,false);
    error.number = 9;
    error.line2 = error.line;
    std::__cxx11::string::assign((char *)&error.description);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
    std::__cxx11::string::~string((string *)&error.description);
    pcVar4 = (this->m_Buffer)._M_dataplus._M_p;
    sVar6 = (this->m_Buffer)._M_string_length;
    pos = sVar6 - 1;
    if ((pcVar4[sVar6 - 1] != ' ') && (pcVar4[sVar6 - 1] != '\n')) goto LAB_00141ad0;
  }
  uVar7 = 0;
  do {
    cVar2 = pcVar4[sVar6 - 1];
    if ((cVar2 == '\n') || (cVar2 == ' ')) {
      if ((long)sVar6 < 2) break;
    }
    else if (((long)sVar6 < 2) || (cVar2 != '\r')) break;
    uVar7 = uVar7 + (cVar2 == '\n');
    sVar6 = sVar6 - 1;
  } while( true );
  if (1 < uVar7) {
    this_00 = &error.description;
    error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
    error.description._M_string_length = 0;
    error.description.field_2._M_local_buf[0] = '\0';
    lVar5 = GetLineNumber(this,pos,false);
    error.line2 = lVar5 + 1;
    error.line = (lVar5 - uVar7) + 3;
    error.number = 9;
    std::__cxx11::string::assign((char *)this_00);
    pcVar3 = (char *)operator_new__(10);
    snprintf(pcVar3,10,"%ld",uVar7);
    std::__cxx11::string::append((char *)this_00);
    operator_delete__(pcVar3);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&error);
    std::__cxx11::string::~string((string *)this_00);
  }
LAB_00141ad0:
  return cVar1 == '\n';
}

Assistant:

bool Parser::CheckEndOfFileNewLine()
{
  m_TestsDone[EOF_NEW_LINE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The file should have only one new line");
  m_TestsDescription[EOF_NEW_LINE] = val;
  delete [] val;
  bool hasError = false;

  // Check if the last character is an end of line
  if(m_Buffer[m_Buffer.size()-1] != '\n')
    {
    Error error;
    error.line = this->GetLineNumber(m_Buffer.size()-1,false);
    error.line2 = error.line;
    error.number = EOF_NEW_LINE;
    error.description = "No new line at the end of file";
    m_ErrorList.push_back(error);
    hasError = true;
    }

  // Check the number empty lines at the end of the file
  if((m_Buffer[m_Buffer.size()-1] == ' ') || (m_Buffer[m_Buffer.size()-1] == '\n'))
    {
    long i = static_cast<long>(m_Buffer.size())-1;
    unsigned long numberOfEmptyLines = 0;
    while( ((m_Buffer[i] == '\n') ||  (m_Buffer[i] == ' ') || (m_Buffer[i] == '\r')) && (i>0))
      {
      if(m_Buffer[i] == '\n')
        {
        numberOfEmptyLines++;
        }
      i-=1;
      }

    if(numberOfEmptyLines>1)
      {
      // Maybe should be info and not error
      Error info;
      info.line2 = this->GetLineNumber(m_Buffer.size()-1,false)+1;
      info.line = info.line2-numberOfEmptyLines+2;
      info.number = EOF_NEW_LINE;
      info.description = "Number of empty lines at the end of files: ";
      constexpr size_t length = 10;
      char* localval = new char[length];
      snprintf(localval,length,"%ld",numberOfEmptyLines);
      info.description += localval;
      delete [] localval;
      m_ErrorList.push_back(info);
      }
    }

  return !hasError;
}